

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

llama_context * llama_init_from_model(llama_model *model,llama_context_params params)

{
  undefined4 uVar1;
  char cVar2;
  llama_context *this;
  long lVar3;
  char cVar4;
  char *format;
  llama_context_params *plVar5;
  undefined8 *puVar6;
  byte bVar7;
  llama_context_params in_stack_ffffffffffffff68;
  
  uVar1 = params._96_4_;
  bVar7 = 0;
  if (model == (llama_model *)0x0) {
    format = "%s: model cannot be NULL\n";
  }
  else if (params.n_ubatch == 0 && params.n_batch == 0) {
    format = "%s: n_batch and n_ubatch cannot both be zero\n";
  }
  else if ((params.n_ctx == 0) && ((model->hparams).n_ctx_train == 0)) {
    format = "%s: n_ctx and model->hparams.n_ctx_train cannot both be zero\n";
  }
  else {
    cVar4 = params.flash_attn;
    if ((params.flash_attn == true) && (model->arch == LLM_ARCH_GROK)) {
      cVar4 = '\0';
      params._96_4_ = uVar1;
      llama_log_internal(GGML_LOG_LEVEL_WARN,
                         "%s: flash_attn is not compatible with Grok - forcing off\n",
                         "llama_init_from_model");
      params._96_4_ = params._96_4_ & 0xffffff;
      uVar1 = params._96_4_;
    }
    params._96_4_ = uVar1;
    cVar2 = ggml_is_quantized(params.type_v);
    if ((cVar2 == '\0') || (cVar4 != '\0')) {
      this = (llama_context *)operator_new(0x398);
      plVar5 = &params;
      puVar6 = (undefined8 *)&stack0xffffffffffffff68;
      for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar6 = *(undefined8 *)plVar5;
        plVar5 = (llama_context_params *)((long)plVar5 + (ulong)bVar7 * -0x10 + 8);
        puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      }
      llama_context::llama_context(this,model,in_stack_ffffffffffffff68);
      return this;
    }
    format = "%s: V cache quantization requires flash_attn\n";
  }
  llama_log_internal(GGML_LOG_LEVEL_ERROR,format,"llama_init_from_model");
  return (llama_context *)0x0;
}

Assistant:

llama_context * llama_init_from_model(
                 llama_model * model,
        llama_context_params   params) {
    if (!model) {
        LLAMA_LOG_ERROR("%s: model cannot be NULL\n", __func__);
        return nullptr;
    }

    if (params.n_batch == 0 && params.n_ubatch == 0) {
        LLAMA_LOG_ERROR("%s: n_batch and n_ubatch cannot both be zero\n", __func__);
        return nullptr;
    }

    if (params.n_ctx == 0 && model->hparams.n_ctx_train == 0) {
        LLAMA_LOG_ERROR("%s: n_ctx and model->hparams.n_ctx_train cannot both be zero\n", __func__);
        return nullptr;
    }

    if (params.flash_attn && model->arch == LLM_ARCH_GROK) {
        LLAMA_LOG_WARN("%s: flash_attn is not compatible with Grok - forcing off\n", __func__);
        params.flash_attn = false;
    }

    if (ggml_is_quantized(params.type_v) && !params.flash_attn) {
        LLAMA_LOG_ERROR("%s: V cache quantization requires flash_attn\n", __func__);
        return nullptr;
    }

    try {
        auto * ctx = new llama_context(*model, params);
        return ctx;
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: failed to initialize the context: %s\n", __func__, err.what());
    }

    return nullptr;
}